

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scrambler.cxx
# Opt level: O1

void __thiscall xray_re::xr_scrambler::init_sboxes(xr_scrambler *this,int seed,int size_mult)

{
  uint8_t uVar1;
  int i;
  uint uVar2;
  uint uVar4;
  int iVar5;
  long lVar3;
  
  lVar3 = 0x103;
  do {
    this->m_enc_sbox[lVar3 + -4] = (char)lVar3 + 0xfc;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 3);
  if (size_mult != 0) {
    iVar5 = size_mult << 8;
    do {
      seed = seed * 0x8088405 + 1;
      uVar2 = (uint)seed >> 0x18;
      do {
        seed = seed * 0x8088405 + 1;
        uVar4 = (uint)seed >> 0x18;
      } while (uVar2 == uVar4);
      uVar1 = this->m_enc_sbox[uVar2];
      this->m_enc_sbox[uVar2] = this->m_enc_sbox[uVar4];
      this->m_enc_sbox[uVar4] = uVar1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  lVar3 = 0;
  do {
    this->m_dec_sbox[this->m_enc_sbox[lVar3]] = (uint8_t)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void xr_scrambler::init_sboxes(int seed, int size_mult)
{
	for (int i = SBOX_SIZE - 1; i >= 0; --i)
		m_enc_sbox[i] = uint8_t(i);
	for (int i = size_mult*SBOX_SIZE, a, b; i != 0; --i) {
		seed = 1 + seed * SEED_MULT;
		a = (seed >> 24) & 0xff;
		do {
			seed = 1 + seed * SEED_MULT;
			b = (seed >> 24) & 0xff;
		} while (a == b);
		std::swap(m_enc_sbox[a], m_enc_sbox[b]);
	}
	for (int i = 0; i != SBOX_SIZE; ++i)
		m_dec_sbox[m_enc_sbox[i]] = uint8_t(i);
}